

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O1

bool __thiscall cmCTestGIT::CommitParser::ProcessLine(CommitParser *this)

{
  SectionType SVar1;
  
  SVar1 = this->Section;
  if ((this->super_DiffParser).super_LineParser.Line._M_string_length == 0) {
    if ((SVar1 == SectionBody) && ((this->super_DiffParser).super_LineParser.LineEnd == '\0')) {
      NextSection(this);
    }
    NextSection(this);
  }
  else if (SVar1 == SectionDiff) {
    DiffParser::ProcessLine(&this->super_DiffParser);
  }
  else if (SVar1 == SectionBody) {
    DoBodyLine(this);
  }
  else if (SVar1 == SectionHeader) {
    DoHeaderLine(this);
  }
  return true;
}

Assistant:

bool ProcessLine() CM_OVERRIDE
  {
    if (this->Line.empty()) {
      if (this->Section == SectionBody && this->LineEnd == '\0') {
        // Skip SectionDiff
        this->NextSection();
      }
      this->NextSection();
    } else {
      switch (this->Section) {
        case SectionHeader:
          this->DoHeaderLine();
          break;
        case SectionBody:
          this->DoBodyLine();
          break;
        case SectionDiff:
          this->DiffParser::ProcessLine();
          break;
        case SectionCount:
          break; // never happens
      }
    }
    return true;
  }